

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O3

bool __thiscall
cmsys::SystemInformationImplementation::QuerySolarisProcessor(SystemInformationImplementation *this)

{
  string *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Alloc_hider _Var2;
  int iVar3;
  long lVar4;
  SystemInformationImplementation *in_RSI;
  string local_48;
  
  lVar4 = sysconf(0x54);
  if (0 < lVar4) {
    this->NumberOfPhysicalCPU = (uint)lVar4;
    this->NumberOfLogicalCPU = (uint)lVar4;
    ParseValueFromKStat_abi_cxx11_(&local_48,in_RSI,"-s clock_MHz");
    _Var2._M_p = local_48._M_dataplus._M_p;
    iVar3 = atoi(local_48._M_dataplus._M_p);
    this->CPUSpeedInMHz = (float)iVar3;
    paVar1 = &local_48.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var2._M_p != paVar1) {
      in_RSI = (SystemInformationImplementation *)(local_48.field_2._M_allocated_capacity + 1);
      operator_delete(_Var2._M_p,(ulong)in_RSI);
    }
    (this->ChipID).Family = 0;
    ParseValueFromKStat_abi_cxx11_(&local_48,in_RSI,"-s cpu_type");
    this_00 = &(this->ChipID).ProcessorName;
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar1) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    (this->ChipID).Model = 0;
    iVar3 = std::__cxx11::string::compare((char *)this_00);
    if (iVar3 != 0) {
      std::__cxx11::string::_M_replace
                ((ulong)&(this->ChipID).Vendor,0,(char *)(this->ChipID).Vendor._M_string_length,
                 0x82e6e0);
      local_48._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"");
      FindManufacturer(this,&local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != paVar1) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return 0 < lVar4;
}

Assistant:

bool SystemInformationImplementation::QuerySolarisProcessor()
{
  if (!this->QueryProcessorBySysconf()) {
    return false;
  }

  // Parse values
  this->CPUSpeedInMHz = static_cast<float>(
    atoi(this->ParseValueFromKStat("-s clock_MHz").c_str()));

  // Chip family
  this->ChipID.Family = 0;

  // Chip Model
  this->ChipID.ProcessorName = this->ParseValueFromKStat("-s cpu_type");
  this->ChipID.Model = 0;

  // Chip Vendor
  if (this->ChipID.ProcessorName != "i386") {
    this->ChipID.Vendor = "Sun";
    this->FindManufacturer();
  }

  return true;
}